

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_unsigned_integer.h
# Opt level: O0

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,unsigned_char,1u,2u,date::character_t<char>&,date::aliases_t<char,4ul,unsigned_char,12ul>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_short,2u,4u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>&,date::character_t<char>&,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               unsigned_integer_t<unsigned_char,_1U,_2U> *fmt,character_t<char> *others,
               aliases_t<char,_4UL,_unsigned_char,_12UL> *others_1,character_t<char> *others_2,
               unsigned_integer_t<unsigned_short,_2U,_4U> *others_3,character_t<char> *others_4,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_5,character_t<char> *others_6,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_7,
               optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>
               *others_8,character_t<char> *others_9,
               cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *others_10)

{
  bool bVar1;
  value_type vVar2;
  ulong uStack_70;
  char_type ch;
  size_t count;
  uchar x;
  character_t<char> *others_local_2;
  aliases_t<char,_4UL,_unsigned_char,_12UL> *others_local_1;
  character_t<char> *others_local;
  unsigned_integer_t<unsigned_char,_1U,_2U> *fmt_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos_local;
  
  count._7_1_ = '\0';
  uStack_70 = 0;
  while ((((uStack_70 < 2 &&
           (bVar1 = iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::
                    operator==(pos,end), !bVar1)) &&
          (vVar2 = iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::
                   operator*(pos), '/' < vVar2)) && (vVar2 < ':'))) {
    count._7_1_ = count._7_1_ * '\n' + vVar2 + -0x30;
    uStack_70 = uStack_70 + 1;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
  }
  if (uStack_70 == 0) {
    pos_local._7_1_ = false;
  }
  else {
    *fmt->value = count._7_1_;
    pos_local._7_1_ =
         read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,date::aliases_t<char,4ul,unsigned_char,12ul>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_short,2u,4u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>&,date::character_t<char>&,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>&>
                   (pos,end,others,others_1,others_2,others_3,others_4,others_5,others_6,others_7,
                    others_8,others_9,others_10);
  }
  return pos_local._7_1_;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, unsigned_integer_t<UnsignedInt, MinLength, MaxLength>& fmt, Others&&... others)
{
    using char_type  = typename iterator_traits<Iterator>::value_type;

    auto x = UnsignedInt{ 0 };
    auto count = std::size_t{ 0 };
    while (count < MaxLength)
    {
        if (pos == end)
            break;

        const char_type ch = *pos;
        if ((ch < char_type{ '0' }) || (ch > char_type{ '9' }))
            break;

        x = 10 * x + static_cast<UnsignedInt>(ch - char_type{ '0' });
        ++count;
        ++pos;
    }

    if (count < MinLength)
        return false;

    fmt.value = x;
    return read_impl(pos, end, std::forward<Others>(others)...);
}